

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::hugeint_t,duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  AggregateFinalizeData *finalize_data_00;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  hugeint_t *in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  hugeint_t *rdata_1;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **sdata_1;
  AggregateFinalizeData finalize_data;
  hugeint_t *rdata;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **sdata;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *local_80;
  AggregateFinalizeData local_78;
  hugeint_t *local_60;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **local_58;
  AggregateFinalizeData local_50;
  hugeint_t *local_38;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    finalize_data_00 =
         (AggregateFinalizeData *)
         ConstantVector::
         GetData<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>*>
                   ((Vector *)0xa79d80);
    local_38 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0xa79d8f);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,in_RDX,in_RSI);
    QuantileScalarOperation<false,duckdb::QuantileStandardType>::
    Finalize<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
              (in_RCX,in_R8,finalize_data_00);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    local_58 = FlatVector::
               GetData<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>*>
                         ((Vector *)0xa79ddd);
    local_60 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xa79dec);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,in_RDX,in_RSI);
    for (local_80 = (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)0x0;
        local_80 < in_RCX;
        local_80 = (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)
                   ((long)&(local_80->v).
                           super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                           super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1)) {
      local_78.result_idx = (long)&in_R8->lower + (long)&local_80->v;
      QuantileScalarOperation<false,duckdb::QuantileStandardType>::
      Finalize<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
                (in_RCX,in_R8,in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}